

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_50934::createDFDCompressedTest1_FormatETC2_R8B8G8_Test::TestBody
          (createDFDCompressedTest1_FormatETC2_R8B8G8_Test *this)

{
  createDFDTestBaseComp<1U,_8U> *pcVar1;
  int iVar2;
  uint *lhs;
  pointer *__ptr;
  char *pcVar3;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  *(ulong *)&(this->super_createDFDCompressedTest1).super_createDFDTestBaseComp<1U,_8U>.
             super_createDFDTestBase<1U,_8U>.expected.field_0x8 =
       (ulong)(byte)(this->super_createDFDCompressedTest1).super_createDFDTestBaseComp<1U,_8U>.
                    super_createDFDTestBase<1U,_8U>.expected.field_0xf << 0x38 | 0x303000101a1;
  *(undefined8 *)
   (this->super_createDFDCompressedTest1).super_createDFDTestBaseComp<1U,_8U>.
   super_createDFDTestBase<1U,_8U>.expected.samples = 0x23f0000;
  pcVar1 = &(this->super_createDFDCompressedTest1).super_createDFDTestBaseComp<1U,_8U>;
  (pcVar1->super_createDFDTestBase<1U,_8U>).expected.samples[0].lower = 0;
  (pcVar1->super_createDFDTestBase<1U,_8U>).expected.samples[0].upper = 0xffffffff;
  lhs = (uint *)createDFDCompressed(8,4,4,1,0);
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_28,"*dfd","sizeof(expected) + 4U",lhs,(unsigned_long *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
               ,0x208,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  iVar2 = memcmp(&(this->super_createDFDCompressedTest1).super_createDFDTestBaseComp<1U,_8U>.
                  super_createDFDTestBase<1U,_8U>.expected,lhs + 1,0x28);
  local_38._M_head_impl._0_4_ = iVar2;
  local_30.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"memcmp(&expected, dfd+1, sizeof(expected))","0",(int *)&local_38,
             (int *)&local_30);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/unittests.cc"
               ,0x209,pcVar3);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  free(lhs);
  return;
}

Assistant:

TEST_F(createDFDCompressedTest1, FormatETC2_R8B8G8) {
    customize(KHR_DF_MODEL_ETC2, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_LINEAR, KHR_DF_FLAG_ALPHA_STRAIGHT,
              3, 3,
              {
                {0, 63, KHR_DF_CHANNEL_ETC2_COLOR, 0, 0, 0, 0, 0, 0xFFFFFFFF},
              }
             );

    uint32_t* dfd = createDFDCompressed(c_ETC2_R8G8B8, 4, 4, 1, s_UNORM);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}